

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displ.cpp
# Opt level: O1

void __thiscall displ::drawParticles(displ *this,vector<particle,_std::allocator<particle>_> *p)

{
  View *this_00;
  float fVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  pointer ppVar4;
  bool bVar5;
  Vector2f *pVVar6;
  Vector2u VVar7;
  Vector2u VVar8;
  Vector2f *pVVar9;
  particle *i;
  pointer ppVar10;
  int iVar11;
  RenderTarget *this_01;
  floatingType *pfVar12;
  float fVar13;
  CircleShape circle;
  RectangleShape rectangle;
  float local_3b8;
  float fStack_3b4;
  float local_3a8;
  float fStack_3a4;
  Rect<float> local_398;
  undefined1 local_388 [16];
  FloatRect local_378;
  undefined1 local_368 [8];
  Transformable local_360 [2];
  RectangleShape local_1c8;
  
  this_01 = &(this->window).super_RenderTarget;
  sf::RenderTarget::clear(this_01,(Color *)&sf::Color::Black);
  local_368._0_4_ = 0.0;
  local_368._4_4_ = 0.0;
  sf::RectangleShape::RectangleShape(&local_1c8,(Vector2f *)local_368);
  local_368 = *(undefined1 (*) [8])&this->box;
  sf::RectangleShape::setSize(&local_1c8,(Vector2f *)local_368);
  sf::Shape::setOutlineColor(&local_1c8.super_Shape,(Color *)&sf::Color::White);
  sf::Shape::setFillColor(&local_1c8.super_Shape,(Color *)&sf::Color::Transparent);
  sf::Shape::setOutlineThickness(&local_1c8.super_Shape,(this->box).x / 100.0);
  sf::RenderTarget::draw(this_01,(Drawable *)&local_1c8,(RenderStates *)sf::RenderStates::Default);
  this_00 = &this->view;
  pVVar6 = sf::View::getSize(this_00);
  fVar13 = pVVar6->x;
  VVar7 = sf::RenderWindow::getSize(&this->window);
  pVVar6 = sf::View::getSize(this_00);
  fVar1 = pVVar6->y;
  VVar8 = sf::RenderWindow::getSize(&this->window);
  fVar13 = fVar1 / (float)((ulong)VVar8 >> 0x20) + fVar13 / (float)((ulong)VVar7 & 0xffffffff);
  if ((this->radius / fVar13) * 1.5 <= 1.0) {
    sf::Vertex::Vertex((Vertex *)local_368);
    ppVar10 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar4 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (ppVar10 != ppVar4) {
      do {
        fVar13 = (ppVar10->velocity).x;
        fVar1 = (ppVar10->velocity).y;
        iVar11 = (int)((fVar13 * fVar13 + fVar1 * fVar1) * 1020.0);
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        local_368._4_4_ = (ppVar10->position).y - this->radius;
        local_368._0_4_ = (ppVar10->position).x - this->radius;
        sf::Color::Color((Color *)&local_398,(byte)iVar11,'\0',~(byte)iVar11,0xff);
        local_360[0]._vptr_Transformable._0_4_ = (Color)local_398.left;
        sf::RenderTarget::draw
                  (this_01,(Vertex *)local_368,1,Points,(RenderStates *)sf::RenderStates::Default);
        ppVar10 = ppVar10 + 1;
      } while (ppVar10 != ppVar4);
    }
  }
  else {
    sf::CircleShape::CircleShape((CircleShape *)local_368,this->radius,0x1e);
    fVar13 = 0.4 / fVar13 + 3.0;
    if (20.0 <= fVar13) {
      fVar13 = 20.0;
    }
    sf::CircleShape::setPointCount((CircleShape *)local_368,(long)(int)fVar13);
    sf::CircleShape::setRadius((CircleShape *)local_368,this->radius);
    pVVar6 = sf::View::getCenter(this_00);
    pVVar9 = sf::View::getSize(this_00);
    VVar2 = *pVVar9;
    VVar3 = *pVVar6;
    pVVar6 = sf::View::getSize(this_00);
    local_3b8 = VVar2.x;
    fStack_3b4 = VVar2.y;
    local_3a8 = VVar3.x;
    fStack_3a4 = VVar3.y;
    local_388._0_4_ = local_3a8 + local_3b8 * -0.5;
    local_388._4_4_ = fStack_3a4 + fStack_3b4 * -0.5;
    local_388._8_8_ = *pVVar6;
    ppVar10 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar4 = (p->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (ppVar10 != ppVar4) {
      pfVar12 = &(ppVar10->velocity).y;
      do {
        sf::Transformable::setPosition
                  (local_360,pfVar12[-3] - this->radius,pfVar12[-2] - this->radius);
        local_378 = sf::Shape::getGlobalBounds((Shape *)local_368);
        local_398.left = 0.0;
        local_398.top = 0.0;
        local_398.width = 0.0;
        local_398.height = 0.0;
        bVar5 = sf::Rect<float>::intersects((Rect<float> *)local_388,&local_378,&local_398);
        if (bVar5) {
          iVar11 = (int)((((vec2f *)(pfVar12 + -1))->x * ((vec2f *)(pfVar12 + -1))->x +
                         *pfVar12 * *pfVar12) * 1020.0);
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          sf::Color::Color((Color *)&local_398,(byte)iVar11,'\0',~(byte)iVar11,0xff);
          sf::Shape::setFillColor((Shape *)local_368,(Color *)&local_398);
          sf::RenderTarget::draw
                    (this_01,(Drawable *)local_368,(RenderStates *)sf::RenderStates::Default);
        }
        ppVar10 = (pointer)(pfVar12 + 1);
        pfVar12 = pfVar12 + 4;
      } while (ppVar10 != ppVar4);
    }
    sf::Shape::~Shape((Shape *)local_368);
  }
  sf::Window::display((Window *)this);
  sf::Shape::~Shape(&local_1c8.super_Shape);
  return;
}

Assistant:

void displ::drawParticles(const std::vector<particle>& p)const
{
	window.clear(sf::Color::Black);

	sf::RectangleShape rectangle;
	rectangle.setSize(sf::Vector2f(box.getX(), box.getY()));
	rectangle.setOutlineColor(sf::Color::White);
	rectangle.setFillColor(sf::Color::Transparent);
	rectangle.setOutlineThickness(box.getX() / 100.f);
	window.draw(rectangle);

	float doubledZoom = view.getSize().x/(float)window.getSize().x + view.getSize().y/(float)window.getSize().y;

	if (radius/doubledZoom*1.5f > 1.f)
	{
		//Kółka są widoczne

		sf::CircleShape circle(radius);

		//Dokładność kształtów rośnie z powiększaniem
		float vertices = 0.4f/doubledZoom + 3.f;
		vertices = vertices < 20.f ? vertices : 20.f;
		circle.setPointCount((int)vertices);

		circle.setRadius(radius);
		int temperature;
		sf::FloatRect viewBoundingBox(view.getCenter() - view.getSize()/2.f, view.getSize());
		for(const auto& i : p)
		{
			circle.setPosition(i.getPosition().getX() - radius, i.getPosition().getY() - radius);

			//Poza ekranem nie rysujemy
			if (!viewBoundingBox.intersects(circle.getGlobalBounds()))
				continue;

			temperature = i.getVelocity().getSquaredLength() * 1020.f; // * 255.f / 0.25f;
			temperature = temperature < 255 ? temperature : 255;
			circle.setFillColor(sf::Color(temperature, 0, 255 - temperature));
			window.draw(circle);
		}
	}
	else
	{
		//Kółka sprowadzają się do punktów
		sf::Vertex point;
		int temperature;
		for(const auto& i : p)
		{
			temperature = i.getVelocity().getSquaredLength() * 1020.f; // * 255.f / 0.25f;
			temperature = temperature < 255 ? temperature : 255;
			point.position = {i.getPosition().getX() - radius, i.getPosition().getY() - radius};
			point.color = sf::Color(temperature, 0, 255 - temperature);
			window.draw(&point, 1, sf::Points);
		}
	}
	window.display();
}